

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O2

void cs::
     foreach_helper<phmap::flat_hash_map<cs_impl::any,cs_impl::any,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>>,std::pair<cs_impl::any,cs_impl::any>>
               (context_t *context,string *iterator,var *obj,
               deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *body)

{
  element_type *peVar1;
  ctrl_t *pcVar2;
  size_t sVar3;
  _Elt_pointer ppsVar4;
  flat_hash_map<cs_impl::any,_cs_impl::any,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
  *pfVar5;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
  *this;
  _Elt_pointer ppsVar6;
  _Elt_pointer ppsVar7;
  scope_guard scope;
  const_iterator __begin0;
  scope_guard local_d0;
  _Map_pointer local_c8;
  any local_c0;
  pair<cs_impl::any,_cs_impl::any> local_b8;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *local_a8;
  iterator local_a0 [7];
  
  pfVar5 = cs_impl::any::
           const_val<phmap::flat_hash_map<cs_impl::any,cs_impl::any,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>>>
                     (obj);
  if ((pfVar5->
      super_raw_hash_map<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
      ).
      super_raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
      .size_ != 0) {
    peVar1 = (((context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
             instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar1->break_block == true) {
      peVar1->break_block = false;
    }
    if (peVar1->continue_block == true) {
      peVar1->continue_block = false;
    }
    scope_guard::scope_guard(&local_d0,context);
    this = (raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
            *)cs_impl::any::
              const_val<phmap::flat_hash_map<cs_impl::any,cs_impl::any,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>>>
                        (obj);
    local_a0[0] = phmap::priv::
                  raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
                  ::begin(this);
    pcVar2 = this->ctrl_;
    sVar3 = this->capacity_;
    local_a8 = body;
    while (local_a0[0].ctrl_ != pcVar2 + sVar3) {
      std::pair<cs_impl::any,_cs_impl::any>::pair<const_cs_impl::any,_cs_impl::any,_true>
                (&local_b8,(pair<const_cs_impl::any,_cs_impl::any> *)local_a0[0].field_1.slot_);
      process_context::poll_event((process_context *)current_process);
      peVar1 = (((context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
               ->instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      cs_impl::any::any<std::pair<cs_impl::any,cs_impl::any>>(&local_c0,&local_b8);
      domain_manager::add_var_no_return<std::__cxx11::string_const&>
                (&(peVar1->super_runtime_type).storage,iterator,&local_c0);
      cs_impl::any::recycle(&local_c0);
      ppsVar6 = (body->
                super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>).
                _M_impl.super__Deque_impl_data._M_start._M_cur;
      ppsVar7 = (body->
                super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>).
                _M_impl.super__Deque_impl_data._M_start._M_last;
      local_c8 = (body->
                 super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>).
                 _M_impl.super__Deque_impl_data._M_start._M_node;
      ppsVar4 = (body->
                super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>).
                _M_impl.super__Deque_impl_data._M_finish._M_cur;
      while (ppsVar6 != ppsVar4) {
        statement_base::run(*ppsVar6);
        peVar1 = (((context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr)->instance).
                 super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (peVar1->return_fcall != false) {
LAB_001b7fe2:
          std::pair<cs_impl::any,_cs_impl::any>::~pair(&local_b8);
          goto LAB_001b7fec;
        }
        if (peVar1->break_block == true) {
          peVar1->break_block = false;
          goto LAB_001b7fe2;
        }
        if (peVar1->continue_block != false) {
          peVar1->continue_block = false;
          break;
        }
        ppsVar6 = ppsVar6 + 1;
        if (ppsVar6 == ppsVar7) {
          ppsVar6 = local_c8[1];
          local_c8 = local_c8 + 1;
          ppsVar7 = ppsVar6 + 0x40;
        }
      }
      scope_guard::clear(&local_d0);
      body = local_a8;
      std::pair<cs_impl::any,_cs_impl::any>::~pair(&local_b8);
      phmap::priv::
      raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
      ::iterator::operator++(local_a0);
    }
LAB_001b7fec:
    scope_guard::~scope_guard(&local_d0);
  }
  return;
}

Assistant:

void foreach_helper(const context_t &context, const string &iterator, const var &obj,
	                    std::deque<statement_base *> &body)
	{
		if (obj.const_val<T>().empty())
			return;
		if (context->instance->break_block)
			context->instance->break_block = false;
		if (context->instance->continue_block)
			context->instance->continue_block = false;
		scope_guard scope(context);
		for (const X &it: obj.const_val<T>()) {
			current_process->poll_event();
			context->instance->storage.add_var_no_return(iterator, it);
			for (auto &ptr: body) {
				try {
					ptr->run();
				}
				catch (const cs::exception &e) {
					throw e;
				}
				catch (const std::exception &e) {
					throw exception(ptr->get_line_num(), ptr->get_file_path(), ptr->get_raw_code(), e.what());
				}
				if (context->instance->return_fcall) {
					return;
				}
				if (context->instance->break_block) {
					context->instance->break_block = false;
					return;
				}
				if (context->instance->continue_block) {
					context->instance->continue_block = false;
					break;
				}
			}
			scope.clear();
		}
	}